

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<unsigned_int>::Resize(TPZVec<unsigned_int> *this,int64_t newsize,uint *object)

{
  uint uVar1;
  uint *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  int iVar15;
  undefined1 auVar14 [16];
  
  if (-1 < newsize) {
    lVar8 = this->fNElements;
    if (lVar8 != newsize) {
      if (newsize == 0) {
        puVar6 = (uint *)0x0;
      }
      else {
        puVar6 = (uint *)operator_new__(-(ulong)((ulong)newsize >> 0x3e != 0) | newsize * 4);
      }
      if (newsize <= lVar8) {
        lVar8 = newsize;
      }
      if (lVar8 < 1) {
        lVar7 = 0;
      }
      else {
        puVar2 = this->fStore;
        lVar7 = 0;
        do {
          puVar6[lVar7] = puVar2[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar8 != lVar7);
      }
      auVar5 = _DAT_014f8b30;
      auVar4 = _DAT_014f8350;
      auVar3 = _DAT_014f8340;
      lVar8 = newsize - lVar7;
      if (lVar8 != 0 && lVar7 <= newsize) {
        uVar1 = *object;
        lVar9 = lVar8 + -1;
        auVar11._8_4_ = (int)lVar9;
        auVar11._0_8_ = lVar9;
        auVar11._12_4_ = (int)((ulong)lVar9 >> 0x20);
        uVar10 = 0;
        auVar11 = auVar11 ^ _DAT_014f8350;
        do {
          auVar13._8_4_ = (int)uVar10;
          auVar13._0_8_ = uVar10;
          auVar13._12_4_ = (int)(uVar10 >> 0x20);
          auVar14 = (auVar13 | auVar3) ^ auVar4;
          iVar12 = auVar11._4_4_;
          if ((bool)(~(auVar14._4_4_ == iVar12 && auVar11._0_4_ < auVar14._0_4_ ||
                      iVar12 < auVar14._4_4_) & 1)) {
            puVar6[lVar7 + uVar10] = uVar1;
          }
          if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
              auVar14._12_4_ <= auVar11._12_4_) {
            puVar6[lVar7 + uVar10 + 1] = uVar1;
          }
          auVar13 = (auVar13 | auVar5) ^ auVar4;
          iVar15 = auVar13._4_4_;
          if (iVar15 <= iVar12 && (iVar15 != iVar12 || auVar13._0_4_ <= auVar11._0_4_)) {
            puVar6[lVar7 + uVar10 + 2] = uVar1;
            puVar6[lVar7 + uVar10 + 3] = uVar1;
          }
          uVar10 = uVar10 + 4;
        } while ((lVar8 + 3U & 0xfffffffffffffffc) != uVar10);
      }
      if (this->fStore != (uint *)0x0) {
        operator_delete__(this->fStore);
        this->fStore = (uint *)0x0;
      }
      this->fStore = puVar6;
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  std::ostream::flush();
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}